

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  allocator<char> local_349;
  string local_348;
  undefined1 local_328 [8];
  string srcdir;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream fout;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string fname;
  LaunchHelper *this_local;
  
  fname.field_2._8_8_ = this;
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  cmAlphaNum::cmAlphaNum(&local_60,&this->Handler->CTestLaunchDir);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,"/CTestLaunchConfig.cmake");
  cmStrCat<>((string *)local_30,&local_60,(cmAlphaNum *)&fout.field_0x260);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2f8,(string *)local_30,false,None);
  this_00 = this->CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"SourceDirectory",&local_349);
  cmCTest::GetCTestConfiguration((string *)local_328,this_00,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  poVar1 = std::operator<<((ostream *)local_2f8,"set(CTEST_SOURCE_DIRECTORY \"");
  poVar1 = std::operator<<(poVar1,(string *)local_328);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)local_328);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname =
    cmStrCat(this->Handler->CTestLaunchDir, "/CTestLaunchConfig.cmake");
  cmGeneratedFileStream fout(fname);
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}